

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,uchar element)

{
  type tVar1;
  uchar local_12;
  uchar local_11;
  FlatBufferBuilderImpl<false> *pFStack_10;
  uchar element_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_11 = element;
  pFStack_10 = this;
  AssertScalarT<unsigned_char>(this);
  Align(this,1);
  local_12 = EndianScalar<unsigned_char>(local_11);
  vector_downward<unsigned_int>::push_small<unsigned_char>(&this->buf_,&local_12);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }